

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O3

void __thiscall tcu::LogWriteFailedError::LogWriteFailedError(LogWriteFailedError *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Writing to test log failed","");
  ResourceError::ResourceError(&this->super_ResourceError,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__Exception_021818e8;
  return;
}

Assistant:

LogWriteFailedError (void) : ResourceError("Writing to test log failed") {}